

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Context *context)

{
  Image *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  ostream *poVar2;
  string *psVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__x;
  pointer *ppdVar4;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> point;
  vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Back projection Context Object\n",0x1f);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::vector
            (&local_48,&context->Images);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    images { ",0xd);
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector(&local_48);
  point.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)context;
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::vector
            (&local_48,&context->Images);
  psVar1 = local_48.
           super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppdVar4 = (pointer *)
                 local_48.
                 super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; (pointer)ppdVar4 != psVar1;
      ppdVar4 = ppdVar4 + 2) {
    this = (Image *)*ppdVar4;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar4[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    psVar3 = Image::get_fileName_abi_cxx11_(this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  __x = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)(point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage + 3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_48,__x);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    points { ",0xd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_48,__x);
  for (ppdVar4 = (pointer *)
                 local_48.
                 super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      (pointer)ppdVar4 !=
      local_48.super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppdVar4 = ppdVar4 + 3) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_68,
               (vector<double,_std::allocator<double>_> *)ppdVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
    poVar2 = std::ostream::_M_insert<double>(*(double *)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_68 + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_68 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    operations available.",0x19);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Context &context)
{
    //Output the pertinent information of the context to the stream.
    os << "Back projection Context Object\n";

    os << std::setw(4) << context.listImages().size() << "    images { ";
    for (auto image : context.listImages())
    {
        os << image->get_fileName() << " ";
    }
    os << "}\n";

    os << std::setw(4) << context.listPoints().size() << "    points { ";
    for (auto point : context.listPoints())
    {
        os << "{" << point[0] << "," << point[1] << "," << point[2] << "} ";
    }
    os << "}\n";

    os << std::setw(4) << context.listOperations().size() << "    operations available.";

    return os;
}